

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::anon_unknown_26::AssertionPrinter::printExpressionWas(AssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  AssertionPrinter *unaff_retaddr;
  ColourGuard *guard;
  ColourGuard *this_00;
  ColourImpl *in_stack_ffffffffffffffc8;
  ColourGuard local_18;
  
  bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1b40ac);
  if (bVar1) {
    std::operator<<((ostream *)*in_RDI,';');
    guard = (ColourGuard *)*in_RDI;
    this_00 = &local_18;
    ColourImpl::guardColour(in_stack_ffffffffffffffc8,(Code)((ulong)this_00 >> 0x20));
    poVar2 = Catch::operator<<((ostream *)this_00,guard);
    std::operator<<(poVar2," expression was:");
    ColourImpl::ColourGuard::~ColourGuard(this_00);
    printOriginalExpression(unaff_retaddr);
  }
  return;
}

Assistant:

void printExpressionWas() {
        if (result.hasExpression()) {
            stream << ';';
            {
                stream << colourImpl->guardColour(compactDimColour) << " expression was:";
            }
            printOriginalExpression();
        }
    }